

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

string * __thiscall OIDType::string_abi_cxx11_(OIDType *this)

{
  long lVar1;
  size_type sVar2;
  size_t sVar3;
  long lStack_40;
  int itemLength;
  long item;
  char buffer [16];
  uchar *puStack_20;
  int i;
  uint8_t *dataPtr;
  OIDType *this_local;
  
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    puStack_20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
    std::__cxx11::string::operator=((string *)&this->_value,".1.3");
    if ((this->valid & 1U) != 0) {
      puStack_20 = puStack_20 + 1;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      buffer._12_4_ = (int)sVar2 + -1;
      while (0 < (int)buffer._12_4_) {
        memset(&item,0,0x10);
        lStack_40 = 0;
        sVar3 = decode_ber_longform_integer(puStack_20,&stack0xffffffffffffffc0,buffer._12_4_);
        puStack_20 = puStack_20 + (int)sVar3;
        buffer._12_4_ = buffer._12_4_ - (int)sVar3;
        item._0_1_ = 0x2e;
        long_to_buf((char *)((long)&item + 1),lStack_40,0);
        std::__cxx11::string::append((char *)&this->_value);
      }
    }
  }
  this_local = (OIDType *)&this->_value;
  return (string *)this_local;
}

Assistant:

const std::string& OIDType::string() {
    if(!this->_value.length()){
        const uint8_t* dataPtr = this->data.data();

        this->_value = ".1.3";
        if(!this->valid) return this->_value;

        dataPtr++;

        int i = this->data.size() - 1;
        char buffer[16];

        while(i > 0){
            memset(buffer, 0, sizeof(buffer));
            long item = 0;
            int itemLength = decode_ber_longform_integer(dataPtr, &item, i);
            dataPtr += itemLength; i -= itemLength;

            buffer[0] = '.';
            long_to_buf(buffer+1, item);
            this->_value.append(buffer);
        }
    }
    return this->_value;
}